

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_int64(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
           int64_t val,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  binary_stream_sink *pbVar1;
  size_t *psVar2;
  pointer psVar3;
  ldiv_t lVar4;
  int iVar5;
  undefined7 in_register_00000011;
  uint8_t ch;
  ushort uVar6;
  long lVar8;
  ldiv_t lVar9;
  ldiv_t lVar10;
  uint8_t buf [8];
  ulong local_20;
  uint uVar7;
  
  iVar5 = (int)CONCAT71(in_register_00000011,tag);
  if (iVar5 == 7) {
    if (val == 0) {
LAB_0055202d:
      val = 0;
LAB_00552032:
      lVar10.rem = 0;
      lVar10.quot = val;
    }
    else {
      lVar10 = ldiv(val,1000000000);
      lVar9.rem = -lVar10.rem;
      lVar9.quot = lVar10.quot;
      if (lVar10.rem < 1) {
        lVar10 = lVar9;
      }
    }
  }
  else {
    if (iVar5 != 6) {
      if (iVar5 == 5) goto LAB_00552032;
      uVar6 = (ushort)val;
      uVar7 = (uint)val;
      if (val < 0) {
        if (val < -0x20) {
          pbVar1 = &this->sink_;
          if (val < -0x80) {
            if (val < -0x8000) {
              if (val < -0x80000000) {
                binary_stream_sink::push_back(pbVar1,0xd3);
                local_20 = (ulong)val >> 0x38 | (val & 0xff000000000000U) >> 0x28 |
                           (val & 0xff0000000000U) >> 0x18 | (val & 0xff00000000U) >> 8 |
                           (val & 0xff000000U) << 8 | (val & 0xff0000U) << 0x18 |
                           (val & 0xff00U) << 0x28 | val << 0x38;
                lVar8 = 0;
                do {
                  binary_stream_sink::push_back(pbVar1,*(uint8_t *)((long)&local_20 + lVar8));
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 8);
              }
              else {
                binary_stream_sink::push_back(pbVar1,0xd2);
                local_20 = CONCAT44(local_20._4_4_,
                                    uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8
                                    | uVar7 << 0x18);
                lVar8 = 0;
                do {
                  binary_stream_sink::push_back(pbVar1,*(uint8_t *)((long)&local_20 + lVar8));
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
              }
            }
            else {
              binary_stream_sink::push_back(pbVar1,0xd1);
              local_20 = CONCAT62(local_20._2_6_,uVar6 << 8 | uVar6 >> 8);
              lVar8 = 0;
              do {
                binary_stream_sink::push_back(pbVar1,*(uint8_t *)((long)&local_20 + lVar8));
                lVar8 = lVar8 + 1;
              } while (lVar8 != 2);
            }
            goto LAB_00552039;
          }
          ch = 0xd0;
          goto LAB_005520c7;
        }
      }
      else if (0x7f < val) {
        pbVar1 = &this->sink_;
        if (0xff < val) {
          if (val < 0x10000) {
            binary_stream_sink::push_back(pbVar1,0xcd);
            local_20 = CONCAT62(local_20._2_6_,uVar6 << 8 | uVar6 >> 8);
            lVar8 = 0;
            do {
              binary_stream_sink::push_back(pbVar1,*(uint8_t *)((long)&local_20 + lVar8));
              lVar8 = lVar8 + 1;
            } while (lVar8 != 2);
          }
          else if (val < 0x100000000) {
            binary_stream_sink::push_back(pbVar1,0xce);
            local_20 = CONCAT44(local_20._4_4_,
                                uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                                uVar7 << 0x18);
            lVar8 = 0;
            do {
              binary_stream_sink::push_back(pbVar1,*(uint8_t *)((long)&local_20 + lVar8));
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
          }
          else {
            binary_stream_sink::push_back(pbVar1,0xcf);
            local_20 = (ulong)val >> 0x38 | (val & 0xff000000000000U) >> 0x28 |
                       (val & 0xff0000000000U) >> 0x18 | (val & 0xff00000000U) >> 8 |
                       (val & 0xff000000U) << 8 | (val & 0xff0000U) << 0x18 |
                       (val & 0xff00U) << 0x28 | val << 0x38;
            lVar8 = 0;
            do {
              binary_stream_sink::push_back(pbVar1,*(uint8_t *)((long)&local_20 + lVar8));
              lVar8 = lVar8 + 1;
            } while (lVar8 != 8);
          }
          goto LAB_00552039;
        }
        ch = 0xcc;
LAB_005520c7:
        binary_stream_sink::push_back(&this->sink_,ch);
      }
      binary_stream_sink::push_back(&this->sink_,(uint8_t)val);
      goto LAB_00552039;
    }
    if (val == 0) goto LAB_0055202d;
    lVar9 = ldiv(val,1000);
    lVar8 = lVar9.rem;
    lVar4.rem = lVar8 * 1000000;
    lVar4.quot = lVar9.quot;
    lVar10.rem = lVar8 * -1000000;
    lVar10.quot = lVar9.quot;
    if (-1 < lVar8) {
      lVar10 = lVar4;
    }
  }
  write_timestamp(this,lVar10.quot,lVar10.rem);
LAB_00552039:
  psVar3 = (this->stack_).
           super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar3) {
    psVar2 = &psVar3[-1].index_;
    *psVar2 = *psVar2 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t val, 
            semantic_tag tag, 
            const ser_context&,
            std::error_code&) final
        {
            switch (tag)
            {
                case semantic_tag::epoch_second:
                    write_timestamp(val, 0);
                    break;
                case semantic_tag::epoch_milli:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(val,millis_in_second);
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem*nanos_in_milli;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                case semantic_tag::epoch_nano:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(val,static_cast<int64_t>(nanos_in_second));
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                default:
                {
                    if (val >= 0)
                    {
                        if (val <= 0x7f)
                        {
                            // positive fixnum stores 7-bit positive integer
                            sink_.push_back(static_cast<uint8_t>(val));
                        }
                        else if (val <= (std::numeric_limits<uint8_t>::max)())
                        {
                            // uint 8 stores a 8-bit unsigned integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint8_type);
                            sink_.push_back(static_cast<uint8_t>(val));
                        }
                        else if (val <= (std::numeric_limits<uint16_t>::max)())
                        {
                            // uint 16 stores a 16-bit big-endian unsigned integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint16_type);
                            binary::native_to_big(static_cast<uint16_t>(val),std::back_inserter(sink_));
                        }
                        else if (val <= (std::numeric_limits<uint32_t>::max)())
                        {
                            // uint 32 stores a 32-bit big-endian unsigned integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint32_type);
                            binary::native_to_big(static_cast<uint32_t>(val),std::back_inserter(sink_));
                        }
                        else if (val <= (std::numeric_limits<int64_t>::max)())
                        {
                            // int 64 stores a 64-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint64_type);
                            binary::native_to_big(static_cast<uint64_t>(val),std::back_inserter(sink_));
                        }
                    }
                    else
                    {
                        if (val >= -32)
                        {
                            // negative fixnum stores 5-bit negative integer
                            binary::native_to_big(static_cast<int8_t>(val), std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int8_t>::lowest)())
                        {
                            // int 8 stores a 8-bit signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int8_type);
                            binary::native_to_big(static_cast<int8_t>(val),std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int16_t>::lowest)())
                        {
                            // int 16 stores a 16-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int16_type);
                            binary::native_to_big(static_cast<int16_t>(val),std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int32_t>::lowest)())
                        {
                            // int 32 stores a 32-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int32_type);
                            binary::native_to_big(static_cast<int32_t>(val),std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int64_t>::lowest)())
                        {
                            // int 64 stores a 64-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int64_type);
                            binary::native_to_big(static_cast<int64_t>(val),std::back_inserter(sink_));
                        }
                    }
                }
                break;
            }
            end_value();
            JSONCONS_VISITOR_RETURN;
        }